

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O2

optional<long> ParseMoney(string *money_string)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  char *in_RDX;
  char *in_R9;
  byte *pbVar6;
  _Storage<long,_true> unaff_R14;
  ulong uVar7;
  long in_FS_OFFSET;
  string_view str_00;
  string_view str_01;
  optional<long> oVar8;
  string_view str_02;
  string_view pattern;
  string strWhole;
  string str;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  str_02._M_str = in_RDX;
  str_02._M_len = (size_t)(money_string->_M_dataplus)._M_p;
  bVar3 = util::ContainsNoNUL((util *)money_string->_M_string_length,str_02);
  if (bVar3) {
    str_01._M_str = (char *)0x6;
    str_01._M_len = (size_t)(money_string->_M_dataplus)._M_p;
    pattern._M_str = in_R9;
    pattern._M_len = (size_t)" \f\n\r\t\v";
    util::TrimString_abi_cxx11_(&str,(util *)money_string->_M_string_length,str_01,pattern);
    if (str._M_string_length != 0) {
      strWhole._M_dataplus._M_p = (pointer)&strWhole.field_2;
      strWhole._M_string_length = 0;
      strWhole.field_2._M_local_buf[0] = '\0';
      while( true ) {
        pbVar6 = (byte *)str._M_dataplus._M_p + 1;
        bVar1 = *str._M_dataplus._M_p;
        uVar4 = 0;
        if (bVar1 - 9 < 5) goto LAB_006200d2;
        if (bVar1 == 0) {
          uVar4 = 0;
          if (strWhole._M_string_length < 0xb) {
            uVar7 = 0;
            goto LAB_00620124;
          }
          goto LAB_006200d2;
        }
        if (bVar1 == 0x20) goto LAB_006200d2;
        if (bVar1 == 0x2e) break;
        if (9 < (byte)(bVar1 - 0x30)) goto LAB_006200c1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (&strWhole,
                   (__const_iterator)(strWhole._M_dataplus._M_p + strWhole._M_string_length),bVar1);
        str._M_dataplus._M_p = (pointer)pbVar6;
      }
      uVar7 = 0;
      for (uVar4 = 10000000; (bVar1 = *pbVar6, (byte)(bVar1 - 0x30) < 10 && (uVar4 != 0));
          uVar4 = uVar4 / 10) {
        uVar7 = uVar7 + ((ulong)bVar1 - 0x30) * uVar4;
        pbVar6 = pbVar6 + 1;
      }
      if ((ulong)bVar1 == 0) {
        uVar4 = 0;
        if ((strWhole._M_string_length < 0xb) && (uVar4 = 0, uVar7 < 0x5f5e101)) {
LAB_00620124:
          str_00._M_str = strWhole._M_dataplus._M_p;
          str_00._M_len = strWhole._M_string_length;
          lVar5 = LocaleIndependentAtoi<long>(str_00);
          unaff_R14._M_value = lVar5 * 100000000 + uVar7;
          uVar4 = (ulong)((ulong)unaff_R14 < 0x775f05a074001);
        }
      }
      else {
LAB_006200c1:
        uVar4 = 0;
      }
LAB_006200d2:
      std::__cxx11::string::~string((string *)&strWhole);
      goto LAB_006200da;
    }
    uVar4 = 0;
LAB_006200da:
    std::__cxx11::string::~string((string *)&str);
  }
  else {
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar4;
    oVar8.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = unaff_R14._M_value;
    return (optional<long>)
           oVar8.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CAmount> ParseMoney(const std::string& money_string)
{
    if (!ContainsNoNUL(money_string)) {
        return std::nullopt;
    }
    const std::string str = TrimString(money_string);
    if (str.empty()) {
        return std::nullopt;
    }

    std::string strWhole;
    int64_t nUnits = 0;
    const char* p = str.c_str();
    for (; *p; p++)
    {
        if (*p == '.')
        {
            p++;
            int64_t nMult = COIN / 10;
            while (IsDigit(*p) && (nMult > 0))
            {
                nUnits += nMult * (*p++ - '0');
                nMult /= 10;
            }
            break;
        }
        if (IsSpace(*p))
            return std::nullopt;
        if (!IsDigit(*p))
            return std::nullopt;
        strWhole.insert(strWhole.end(), *p);
    }
    if (*p) {
        return std::nullopt;
    }
    if (strWhole.size() > 10) // guard against 63 bit overflow
        return std::nullopt;
    if (nUnits < 0 || nUnits > COIN)
        return std::nullopt;
    int64_t nWhole = LocaleIndependentAtoi<int64_t>(strWhole);
    CAmount value = nWhole * COIN + nUnits;

    if (!MoneyRange(value)) {
        return std::nullopt;
    }

    return value;
}